

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::StressTestConfig::operator==(StressTestConfig *this,StressTestConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  StressTestConfig *other_local;
  StressTestConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    bVar2 = protozero::operator==(&this->trace_config_,&other->trace_config_);
    local_19 = false;
    if (((((bVar2) && (local_19 = false, this->shmem_size_kb_ == other->shmem_size_kb_)) &&
         (local_19 = false, this->shmem_page_size_kb_ == other->shmem_page_size_kb_)) &&
        ((local_19 = false, this->num_processes_ == other->num_processes_ &&
         (local_19 = false, this->num_threads_ == other->num_threads_)))) &&
       ((local_19 = false, this->max_events_ == other->max_events_ &&
        (local_19 = false, this->nesting_ == other->nesting_)))) {
      bVar2 = protozero::operator==(&this->steady_state_timings_,&other->steady_state_timings_);
      local_19 = false;
      if (((bVar2) && (local_19 = false, this->burst_period_ms_ == other->burst_period_ms_)) &&
         (local_19 = false, this->burst_duration_ms_ == other->burst_duration_ms_)) {
        local_19 = protozero::operator==(&this->burst_timings_,&other->burst_timings_);
      }
    }
  }
  return local_19;
}

Assistant:

bool StressTestConfig::operator==(const StressTestConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && trace_config_ == other.trace_config_
   && shmem_size_kb_ == other.shmem_size_kb_
   && shmem_page_size_kb_ == other.shmem_page_size_kb_
   && num_processes_ == other.num_processes_
   && num_threads_ == other.num_threads_
   && max_events_ == other.max_events_
   && nesting_ == other.nesting_
   && steady_state_timings_ == other.steady_state_timings_
   && burst_period_ms_ == other.burst_period_ms_
   && burst_duration_ms_ == other.burst_duration_ms_
   && burst_timings_ == other.burst_timings_;
}